

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

bool __thiscall Jupiter::Socket::getBlockingMode(Socket *this)

{
  uint uVar1;
  int flags;
  Socket *this_local;
  
  uVar1 = fcntl(this->m_data->rawSock,3,0);
  this_local._7_1_ = uVar1 != 0xffffffff && (uVar1 & 0x800) == 0;
  return this_local._7_1_;
}

Assistant:

bool Jupiter::Socket::getBlockingMode() const {
#if defined _WIN32
	return !m_data->blockMode;
#else // _WIN32
	int flags = fcntl(m_data->rawSock, F_GETFL, 0);
	if (flags == -1) return false;
	return !(flags & O_NONBLOCK);
#endif
}